

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O0

void __thiscall QGraphicsViewPrivate::recalculateContentSize(QGraphicsViewPrivate *this)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  Int IVar5;
  Int IVar6;
  QGraphicsView *pQVar7;
  QStyle *pQVar8;
  QGraphicsViewPrivate *in_RDI;
  long in_FS_OFFSET;
  bool bVar9;
  bool bVar10;
  qreal qVar11;
  qreal qVar12;
  int bottom;
  int top;
  int right;
  int left;
  qreal oldTopIndent;
  qreal oldLeftIndent;
  bool useVerticalScrollBar;
  bool useHorizontalScrollBar;
  int scrollBarExtent;
  bool frameOnlyAround;
  int height;
  int width;
  QGraphicsView *q;
  QPointF savedLastCenterPoint;
  QRectF viewRect;
  QSize maxSize;
  undefined4 in_stack_fffffffffffffed8;
  CacheModeFlag in_stack_fffffffffffffedc;
  QGraphicsViewPrivate *in_stack_fffffffffffffee0;
  QGraphicsView *in_stack_fffffffffffffef0;
  QAbstractSlider *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  int local_d0;
  int local_88;
  int local_84;
  QFlagsStorageHelper<QGraphicsView::CacheModeFlag,_4> local_6c;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> local_68;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> local_64;
  qreal local_60;
  qreal local_58;
  QRectF local_30;
  QSize local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar7 = q_func(in_RDI);
  local_10 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
  local_10 = QAbstractScrollArea::maximumViewportSize
                       ((QAbstractScrollArea *)
                        CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  local_84 = QSize::width((QSize *)0xa3195f);
  local_88 = QSize::height((QSize *)0xa31973);
  local_30.xp = -NAN;
  local_30.yp = -NAN;
  local_30.w = -NAN;
  local_30.h = -NAN;
  QGraphicsView::sceneRect(in_stack_fffffffffffffef0);
  QTransform::mapRect((QRectF *)&local_30);
  pQVar8 = QWidget::style((QWidget *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  iVar3 = (**(code **)(*(long *)pQVar8 + 0xf0))(pQVar8,0x11,0,pQVar7);
  if (iVar3 != 0) {
    if ((in_RDI->super_QAbstractScrollAreaPrivate).hbarpolicy == ScrollBarAlwaysOn) {
      local_88 = local_88 +
                 (in_RDI->super_QAbstractScrollAreaPrivate).super_QFramePrivate.frameWidth * -2;
    }
    if ((in_RDI->super_QAbstractScrollAreaPrivate).vbarpolicy == ScrollBarAlwaysOn) {
      local_84 = local_84 +
                 (in_RDI->super_QAbstractScrollAreaPrivate).super_QFramePrivate.frameWidth * -2;
    }
  }
  pQVar8 = QWidget::style((QWidget *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  iVar4 = (**(code **)(*(long *)pQVar8 + 0xe0))(pQVar8,9,0,pQVar7);
  if (iVar3 != 0) {
    local_d0 = (int)(in_RDI->super_QAbstractScrollAreaPrivate).super_QFramePrivate.frameWidth << 1;
  }
  else {
    local_d0 = 0;
  }
  iVar4 = iVar4 + local_d0;
  qVar11 = QRectF::width(&local_30);
  bVar9 = false;
  if ((double)local_84 < qVar11) {
    bVar9 = (in_RDI->super_QAbstractScrollAreaPrivate).hbarpolicy == ScrollBarAsNeeded;
  }
  qVar11 = QRectF::height(&local_30);
  bVar10 = false;
  if ((double)local_88 < qVar11) {
    bVar10 = (in_RDI->super_QAbstractScrollAreaPrivate).vbarpolicy == ScrollBarAsNeeded;
  }
  if (((bVar9) && ((in_RDI->super_QAbstractScrollAreaPrivate).vbarpolicy == ScrollBarAsNeeded)) &&
     (qVar11 = QRectF::height(&local_30), (double)(local_88 - iVar4) < qVar11)) {
    bVar10 = true;
  }
  if (((bVar10) && ((in_RDI->super_QAbstractScrollAreaPrivate).hbarpolicy == ScrollBarAsNeeded)) &&
     (qVar11 = QRectF::width(&local_30), (double)(local_84 - iVar4) < qVar11)) {
    bVar9 = true;
  }
  if (bVar9) {
    local_88 = local_88 - iVar4;
  }
  if (bVar10) {
    local_84 = local_84 - iVar4;
  }
  local_60 = (in_RDI->lastCenterPoint).xp;
  local_58 = (in_RDI->lastCenterPoint).yp;
  dVar1 = in_RDI->leftIndent;
  dVar2 = in_RDI->topIndent;
  qVar11 = QRectF::left(&local_30);
  iVar3 = q_round_bound(qVar11);
  qVar11 = QRectF::right(&local_30);
  iVar4 = q_round_bound(qVar11 - (double)local_84);
  if (iVar3 < iVar4) {
    in_RDI->leftIndent = 0.0;
    QAbstractSlider::setRange
              ((QAbstractSlider *)in_stack_fffffffffffffef0,
               (int)((ulong)in_stack_fffffffffffffef8 >> 0x20),(int)in_stack_fffffffffffffef8);
    QAbstractSlider::setPageStep
              ((QAbstractSlider *)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
    QAbstractSlider::setSingleStep
              ((QAbstractSlider *)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      QAbstractSlider::setValue
                (in_stack_fffffffffffffef8,(int)((ulong)in_stack_fffffffffffffef0 >> 0x20));
    }
  }
  else {
    local_64.super_QFlagsStorage<Qt::AlignmentFlag>.i =
         (QFlagsStorage<Qt::AlignmentFlag>)
         QFlags<Qt::AlignmentFlag>::operator&
                   ((QFlags<Qt::AlignmentFlag> *)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc
                   );
    IVar5 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_64);
    if (IVar5 == 1) {
      qVar11 = QRectF::left(&local_30);
      in_RDI->leftIndent = -qVar11;
    }
    else if (IVar5 == 2) {
      iVar3 = QSize::width((QSize *)0xa31d90);
      qVar11 = QRectF::width(&local_30);
      qVar12 = QRectF::left(&local_30);
      in_RDI->leftIndent = (((double)iVar3 - qVar11) - qVar12) - 1.0;
    }
    else {
      iVar3 = QSize::width((QSize *)0xa31dfe);
      qVar11 = QRectF::left(&local_30);
      qVar12 = QRectF::right(&local_30);
      in_RDI->leftIndent = (double)(iVar3 / 2) - (qVar11 + qVar12) / 2.0;
    }
    QAbstractSlider::setRange
              ((QAbstractSlider *)in_stack_fffffffffffffef0,
               (int)((ulong)in_stack_fffffffffffffef8 >> 0x20),(int)in_stack_fffffffffffffef8);
  }
  qVar11 = QRectF::top(&local_30);
  iVar3 = q_round_bound(qVar11);
  qVar11 = QRectF::bottom(&local_30);
  iVar4 = q_round_bound(qVar11 - (double)local_88);
  if (iVar3 < iVar4) {
    in_RDI->topIndent = 0.0;
    QAbstractSlider::setRange
              ((QAbstractSlider *)in_stack_fffffffffffffef0,
               (int)((ulong)in_stack_fffffffffffffef8 >> 0x20),(int)in_stack_fffffffffffffef8);
    iVar3 = (int)((ulong)in_stack_fffffffffffffef0 >> 0x20);
    QAbstractSlider::setPageStep
              ((QAbstractSlider *)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
    QAbstractSlider::setSingleStep
              ((QAbstractSlider *)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
    if ((dVar2 != 0.0) || (NAN(dVar2))) {
      QAbstractSlider::setValue(in_stack_fffffffffffffef8,iVar3);
    }
  }
  else {
    local_68.super_QFlagsStorage<Qt::AlignmentFlag>.i =
         (QFlagsStorage<Qt::AlignmentFlag>)
         QFlags<Qt::AlignmentFlag>::operator&
                   ((QFlags<Qt::AlignmentFlag> *)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc
                   );
    IVar5 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_68);
    if (IVar5 == 0x20) {
      qVar11 = QRectF::top(&local_30);
      in_RDI->topIndent = -qVar11;
    }
    else if (IVar5 == 0x40) {
      iVar3 = QSize::height((QSize *)0xa32005);
      in_stack_fffffffffffffef0 = (QGraphicsView *)(double)iVar3;
      qVar11 = QRectF::height(&local_30);
      in_stack_fffffffffffffef8 = (QAbstractSlider *)((double)in_stack_fffffffffffffef0 - qVar11);
      qVar11 = QRectF::top(&local_30);
      in_RDI->topIndent = ((double)in_stack_fffffffffffffef8 - qVar11) - 1.0;
    }
    else {
      iVar3 = QSize::height((QSize *)0xa32073);
      in_stack_fffffffffffffee0 = (QGraphicsViewPrivate *)QRectF::top(&local_30);
      qVar11 = QRectF::bottom(&local_30);
      in_RDI->topIndent = (double)(iVar3 / 2) - ((double)in_stack_fffffffffffffee0 + qVar11) / 2.0;
    }
    QAbstractSlider::setRange
              ((QAbstractSlider *)in_stack_fffffffffffffef0,
               (int)((ulong)in_stack_fffffffffffffef8 >> 0x20),(int)in_stack_fffffffffffffef8);
  }
  (in_RDI->lastCenterPoint).xp = local_60;
  (in_RDI->lastCenterPoint).yp = local_58;
  if ((((dVar1 != in_RDI->leftIndent) || (NAN(dVar1) || NAN(in_RDI->leftIndent))) ||
      (dVar2 != in_RDI->topIndent)) || (NAN(dVar2) || NAN(in_RDI->topIndent))) {
    *(uint *)&in_RDI->field_0x300 = *(uint *)&in_RDI->field_0x300 & 0xffffffdf | 0x20;
    updateAll(in_stack_fffffffffffffee0);
  }
  else {
    bVar9 = QWidget::isRightToLeft((QWidget *)0xa32219);
    if (((bVar9) && (in_RDI->leftIndent == 0.0)) && (!NAN(in_RDI->leftIndent))) {
      *(uint *)&in_RDI->field_0x300 = *(uint *)&in_RDI->field_0x300 & 0xffffffdf | 0x20;
    }
  }
  local_6c.super_QFlagsStorage<QGraphicsView::CacheModeFlag>.i =
       (QFlagsStorage<QGraphicsView::CacheModeFlag>)
       QFlags<QGraphicsView::CacheModeFlag>::operator&
                 ((QFlags<QGraphicsView::CacheModeFlag> *)in_stack_fffffffffffffee0,
                  in_stack_fffffffffffffedc);
  IVar6 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_6c);
  if (IVar6 != 0) {
    *(uint *)&in_RDI->field_0x300 = *(uint *)&in_RDI->field_0x300 & 0xfffff7ff | 0x800;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsViewPrivate::recalculateContentSize()
{
    Q_Q(QGraphicsView);

    const QSize maxSize = q->maximumViewportSize();
    int width = maxSize.width();
    int height = maxSize.height();
    const QRectF viewRect = matrix.mapRect(q->sceneRect());

    bool frameOnlyAround = (q->style()->styleHint(QStyle::SH_ScrollView_FrameOnlyAroundContents, nullptr, q));
    if (frameOnlyAround) {
        if (hbarpolicy == Qt::ScrollBarAlwaysOn)
            height -= frameWidth * 2;
        if (vbarpolicy == Qt::ScrollBarAlwaysOn)
            width -= frameWidth * 2;
    }

    // Adjust the maximum width and height of the viewport based on the width
    // of visible scroll bars.
    const int scrollBarExtent = q->style()->pixelMetric(QStyle::PM_ScrollBarExtent, nullptr, q)
                              + (frameOnlyAround ? frameWidth * 2 : 0);

    // We do not need to subtract the width scrollbars whose policy is
    // Qt::ScrollBarAlwaysOn, this was already done by maximumViewportSize().
    bool useHorizontalScrollBar = (viewRect.width() > width) && hbarpolicy == Qt::ScrollBarAsNeeded;
    bool useVerticalScrollBar = (viewRect.height() > height) && vbarpolicy == Qt::ScrollBarAsNeeded;
    if (useHorizontalScrollBar && vbarpolicy == Qt::ScrollBarAsNeeded) {
        if (viewRect.height() > height - scrollBarExtent)
            useVerticalScrollBar = true;
    }
    if (useVerticalScrollBar && hbarpolicy == Qt::ScrollBarAsNeeded) {
        if (viewRect.width() > width - scrollBarExtent)
            useHorizontalScrollBar = true;
    }
    if (useHorizontalScrollBar)
        height -= scrollBarExtent;
    if (useVerticalScrollBar)
        width -= scrollBarExtent;

    // Setting the ranges of these scroll bars can/will cause the values to
    // change, and scrollContentsBy() will be called correspondingly. This
    // will reset the last center point.
    const QPointF savedLastCenterPoint = lastCenterPoint;

    // Remember the former indent settings
    const qreal oldLeftIndent = leftIndent;
    const qreal oldTopIndent = topIndent;

    // If the whole scene fits horizontally, we center the scene horizontally,
    // and ignore the horizontal scroll bars.
    const int left =  q_round_bound(viewRect.left());
    const int right = q_round_bound(viewRect.right() - width);
    if (left >= right) {
        switch (alignment & Qt::AlignHorizontal_Mask) {
        case Qt::AlignLeft:
            leftIndent = -viewRect.left();
            break;
        case Qt::AlignRight:
            leftIndent = maxSize.width() - viewRect.width() - viewRect.left() - 1;
            break;
        case Qt::AlignHCenter:
        default:
            leftIndent = maxSize.width() / 2 - (viewRect.left() + viewRect.right()) / 2;
            break;
        }

        hbar->setRange(0, 0);
    } else {
        leftIndent = 0;

        hbar->setRange(left, right);
        hbar->setPageStep(width);
        hbar->setSingleStep(width / 20);

        if (oldLeftIndent != 0)
            hbar->setValue(-oldLeftIndent);
    }

    // If the whole scene fits vertically, we center the scene vertically, and
    // ignore the vertical scroll bars.
    const int top = q_round_bound(viewRect.top());
    const int bottom = q_round_bound(viewRect.bottom()  - height);
    if (top >= bottom) {
        switch (alignment & Qt::AlignVertical_Mask) {
        case Qt::AlignTop:
            topIndent = -viewRect.top();
            break;
        case Qt::AlignBottom:
            topIndent = maxSize.height() - viewRect.height() - viewRect.top() - 1;
            break;
        case Qt::AlignVCenter:
        default:
            topIndent = maxSize.height() / 2 - (viewRect.top() + viewRect.bottom()) / 2;
            break;
        }

        vbar->setRange(0, 0);
    } else {
        topIndent = 0;

        vbar->setRange(top, bottom);
        vbar->setPageStep(height);
        vbar->setSingleStep(height / 20);

        if (oldTopIndent != 0)
            vbar->setValue(-oldTopIndent);
    }

    // Restorethe center point from before the ranges changed.
    lastCenterPoint = savedLastCenterPoint;

    // Issue a full update if the indents change.
    // ### If the transform is still the same, we can get away with just a
    // scroll instead.
    if (oldLeftIndent != leftIndent || oldTopIndent != topIndent) {
        dirtyScroll = true;
        updateAll();
    } else if (q->isRightToLeft() && !leftIndent) {
        // In reverse mode, the horizontal scroll always changes after the content
        // size has changed, as the scroll is calculated by summing the min and
        // max values of the range and subtracting the current value. In normal
        // mode the scroll remains unchanged unless the indent has changed.
        dirtyScroll = true;
    }

    if (cacheMode & QGraphicsView::CacheBackground) {
        // Invalidate the background pixmap
        mustResizeBackgroundPixmap = true;
    }
}